

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O2

void extractStructureLevel(Classification *result,string *c,size_t *i)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  string level;
  
  uVar3 = *i;
  pcVar1 = (c->_M_dataplus)._M_p;
  if (pcVar1[uVar3] != '-') goto LAB_001683fe;
  do {
    uVar3 = uVar3 + 1;
    *i = uVar3;
LAB_001683fe:
    if (c->_M_string_length <= uVar3) goto LAB_0016841e;
  } while ((int)pcVar1[uVar3] - 0x30U < 10);
  *i = uVar3 - 1;
LAB_0016841e:
  std::__cxx11::string::substr((ulong)&level,(ulong)c);
  if (level._M_string_length != 0) {
    iVar2 = std::__cxx11::stoi(&level,(size_t *)0x0,10);
    result->sectionLevel = iVar2 + -1;
  }
  std::__cxx11::string::~string((string *)&level);
  return;
}

Assistant:

void extractStructureLevel (Classification &result, string &c, size_t &i) {
    auto start = i;
    if (c[i] == '-') { i++; }
    for (; i < c.size(); i++) {
        if (!isdigit(c[i])) { i--; break; } // i will be incremented after
    }

    string level = c.substr(start, i - start);
    if (level.empty()) { return; }

    result.sectionLevel = std::stoi(level) - 1;
}